

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

bool_t zmFromMont(word *b,octet *a,qr_o *r,void *stack)

{
  int iVar1;
  u64 *in_RCX;
  long in_RDX;
  word *c;
  word *in_stack_00000030;
  void *in_stack_ffffffffffffffc8;
  uint local_4;
  
  u64From(in_RCX,in_stack_ffffffffffffffc8,0x199da7);
  iVar1 = wwCmp(in_RCX + *(long *)(in_RDX + 0x30),*(word **)(in_RDX + 0x18),
                *(size_t *)(in_RDX + 0x30));
  if (iVar1 < 0) {
    wwSetZero(in_RCX,*(size_t *)(in_RDX + 0x30));
    zzMod(in_stack_00000030,b,(size_t)a,(word *)r,(size_t)stack,c);
  }
  local_4 = (uint)(iVar1 < 0);
  return local_4;
}

Assistant:

static bool_t zmFromMont(word b[], const octet a[], const qr_o* r,
	void* stack)
{
	word* c = (word*)stack;
	ASSERT(zmIsOperable(r));
	stack = c + 2 * r->n;
	// a \in r?, c <- a * R
	wwFrom(c + r->n, a, r->no);
	if (!zmIsIn(c + r->n, r))
		return FALSE;
	wwSetZero(c, r->n);
	// b <- c \mod mod
	zzMod(b, c, 2 * r->n, r->mod, r->n, stack);
	return TRUE;
}